

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O1

void __thiscall xercesc_4_0::CMStateSet::setBit(CMStateSet *this,XMLSize_t bitToSet)

{
  CMDynamicBuffer *pCVar1;
  XMLInt32 *pXVar2;
  ArrayIndexOutOfBoundsException *this_00;
  ulong index;
  
  if (bitToSet < this->fBitCount) {
    if (this->fDynamicBuffer == (CMDynamicBuffer *)0x0) {
      pXVar2 = this->fBits + (bitToSet >> 5);
    }
    else {
      index = bitToSet >> 10;
      if (this->fDynamicBuffer->fBitArray[index] == (XMLInt32 *)0x0) {
        allocateChunk(this,index);
        pXVar2 = this->fDynamicBuffer->fBitArray[index];
        pXVar2[0x1c] = 0;
        pXVar2[0x1d] = 0;
        pXVar2[0x1e] = 0;
        pXVar2[0x1f] = 0;
        pXVar2[0x18] = 0;
        pXVar2[0x19] = 0;
        pXVar2[0x1a] = 0;
        pXVar2[0x1b] = 0;
        pXVar2[0x14] = 0;
        pXVar2[0x15] = 0;
        pXVar2[0x16] = 0;
        pXVar2[0x17] = 0;
        pXVar2[0x10] = 0;
        pXVar2[0x11] = 0;
        pXVar2[0x12] = 0;
        pXVar2[0x13] = 0;
        pXVar2[0xc] = 0;
        pXVar2[0xd] = 0;
        pXVar2[0xe] = 0;
        pXVar2[0xf] = 0;
        pXVar2[8] = 0;
        pXVar2[9] = 0;
        pXVar2[10] = 0;
        pXVar2[0xb] = 0;
        pXVar2[4] = 0;
        pXVar2[5] = 0;
        pXVar2[6] = 0;
        pXVar2[7] = 0;
        pXVar2[0] = 0;
        pXVar2[1] = 0;
        pXVar2[2] = 0;
        pXVar2[3] = 0;
      }
      pXVar2 = (XMLInt32 *)
               ((ulong)((uint)(bitToSet >> 3) & 0x7c) + (long)this->fDynamicBuffer->fBitArray[index]
               );
    }
    *pXVar2 = *pXVar2 | 1 << ((byte)bitToSet & 0x1f);
    return;
  }
  pCVar1 = this->fDynamicBuffer;
  this_00 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
  if (pCVar1 == (CMDynamicBuffer *)0x0) {
    ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
               ,0x1a5,Bitset_BadIndex,(MemoryManager *)0x0);
  }
  else {
    ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
               ,0x1a3,Bitset_BadIndex,this->fDynamicBuffer->fMemoryManager);
  }
  __cxa_throw(this_00,&ArrayIndexOutOfBoundsException::typeinfo,
              xercesc_4_0::XMLException::~XMLException);
}

Assistant:

void setBit(const XMLSize_t bitToSet)
    {
        if (bitToSet >= fBitCount)
        {
            if(fDynamicBuffer)
                ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Bitset_BadIndex, fDynamicBuffer->fMemoryManager);
            else
                ThrowXML(ArrayIndexOutOfBoundsException, XMLExcepts::Bitset_BadIndex);
        }

        const XMLInt32 mask = 1UL << (bitToSet % 32);

        // And access the right bit and byte
        if(fDynamicBuffer==0)
        {
            const XMLSize_t byteOfs = bitToSet / 32;
            fBits[byteOfs] &= ~mask;
            fBits[byteOfs] |= mask;
        }
        else
        {
            const XMLSize_t vectorOfs = bitToSet / CMSTATE_BITFIELD_CHUNK;
            if(fDynamicBuffer->fBitArray[vectorOfs]==NULL)
            {
                allocateChunk(vectorOfs);
                for(XMLSize_t index=0;index < CMSTATE_BITFIELD_INT32_SIZE; index++)
                    fDynamicBuffer->fBitArray[vectorOfs][index]=0;
            }
            const XMLSize_t byteOfs = (bitToSet % CMSTATE_BITFIELD_CHUNK) / 32;
            fDynamicBuffer->fBitArray[vectorOfs][byteOfs] &= ~mask;
            fDynamicBuffer->fBitArray[vectorOfs][byteOfs] |= mask;
        }
    }